

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void ft_cmap_done_internal(FT_CMap_conflict cmap)

{
  FT_Memory memory_00;
  FT_Memory memory;
  FT_Face face;
  FT_CMap_Class clazz;
  FT_CMap_conflict cmap_local;
  
  memory_00 = ((cmap->charmap).face)->memory;
  if (cmap->clazz->done != (FT_CMap_DoneFunc)0x0) {
    (*cmap->clazz->done)(cmap);
  }
  ft_mem_free(memory_00,cmap);
  return;
}

Assistant:

static void
  ft_cmap_done_internal( FT_CMap  cmap )
  {
    FT_CMap_Class  clazz  = cmap->clazz;
    FT_Face        face   = cmap->charmap.face;
    FT_Memory      memory = FT_FACE_MEMORY( face );


    if ( clazz->done )
      clazz->done( cmap );

    FT_FREE( cmap );
  }